

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDFace::EdgeArrayIndex(ON_SubDFace *this,ON_SubDEdge *e)

{
  uint local_30;
  uint fei;
  uint face_edge_count;
  ON_SubDEdgePtr *eptr;
  ON_SubDEdge *e_local;
  ON_SubDFace *this_local;
  
  if (e != (ON_SubDEdge *)0x0) {
    _fei = this->m_edge4;
    local_30 = 0;
    while ((local_30 < this->m_edge_count &&
           ((local_30 != 4 || (_fei = this->m_edgex, _fei != (ON_SubDEdgePtr *)0x0))))) {
      if (e == (ON_SubDEdge *)(_fei->m_ptr & 0xfffffffffffffff8)) {
        return local_30;
      }
      local_30 = local_30 + 1;
      _fei = _fei + 1;
    }
  }
  return 0xffffffff;
}

Assistant:

unsigned int ON_SubDFace::EdgeArrayIndex(
  const ON_SubDEdge* e
  ) const
{
  if (nullptr != e)
  {
    const ON_SubDEdgePtr* eptr = m_edge4;
    const unsigned int face_edge_count = m_edge_count;
    for (unsigned int fei = 0; fei < face_edge_count; fei++, eptr++)
    {
      if (4 == fei)
      {
        eptr = m_edgex;
        if (nullptr == eptr)
          break;
      }
      if (e == ON_SUBD_EDGE_POINTER(eptr->m_ptr))
        return fei;
    }
  }

  return ON_UNSET_UINT_INDEX;
}